

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_reduce_qtree_single
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  bsp_pid_t bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bsp_pid_t bVar6;
  void *pvVar7;
  request_t *prVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bsc_step_t local_7c;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar4 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    root = *(int *)(lVar1 + (long)root * 4);
    bVar2 = bsp_pid();
    iVar4 = *(int *)(lVar1 + (long)bVar2 * 4);
  }
  iVar4 = ((iVar3 - root) + iVar4) % iVar3;
  pvVar7 = tmp_space;
  if (iVar3 == 1) {
    pvVar7 = dst;
  }
  (*reducer)(pvVar7,zero,src,nmemb * size);
  local_7c = depends;
  if (iVar3 != 1) {
    uVar5 = int_log(q,iVar3 - 1);
    uVar5 = int_pow(q,uVar5);
    if (0 < (int)uVar5) {
      uVar14 = (ulong)uVar5;
      pvVar7 = (void *)((long)size + (long)tmp_space);
      do {
        iVar13 = (int)uVar14;
        if (iVar4 < iVar13) {
          iVar12 = 1;
          iVar11 = q + -1;
          iVar9 = iVar4;
          if (1 < q) {
            do {
              iVar9 = iVar9 + iVar13;
              if (iVar9 < iVar3) {
                bVar2 = (root + iVar9) % iVar3;
                if (group != (bsc_group_t)0x0) {
                  bVar2 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + (long)bVar2 * 4);
                }
                bVar6 = bsp_pid();
                prVar8 = new_request(local_7c);
                prVar8->kind = GET;
                (prVar8->payload).put.src_addr = tmp_space;
                (prVar8->payload).put.dst_addr = (void *)((long)(iVar12 * size) + (long)pvVar7);
                (prVar8->payload).put.src_pid = bVar2;
                (prVar8->payload).put.dst_pid = bVar6;
                (prVar8->payload).put.size = size;
                (prVar8->payload).put.offset = 0;
                iVar12 = iVar12 + 1;
              }
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          bVar2 = bsp_pid();
          bVar6 = bsp_pid();
          prVar8 = new_request(local_7c);
          prVar8->kind = GET;
          (prVar8->payload).put.src_addr = tmp_space;
          (prVar8->payload).put.dst_addr = pvVar7;
          (prVar8->payload).put.src_pid = bVar2;
          (prVar8->payload).put.dst_pid = bVar6;
          (prVar8->payload).put.size = size;
          (prVar8->payload).put.offset = 0;
          pvVar10 = tmp_space;
          if (iVar13 == 1) {
            pvVar10 = dst;
          }
          prVar8 = new_request(local_7c);
          prVar8->kind = EXEC;
          (prVar8->payload).exec.func = reducer;
          (prVar8->payload).put.dst_addr = pvVar10;
          (prVar8->payload).exec.a0 = zero;
          (prVar8->payload).exec.xs = pvVar7;
          (prVar8->payload).exec.size = iVar12 * size;
        }
        local_7c = local_7c + 1;
        uVar14 = (long)iVar13 / (long)q & 0xffffffff;
      } while (0 < (int)((long)iVar13 / (long)q));
    }
  }
  return local_7c;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_reduce_qtree_single( bsc_step_t depends, 
        bsc_pid_t root, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );
    if (P == 1) {
        return depends;
    }
    
    for (range = int_pow( q, int_log( q, P-1));
            range >= 1; range /= q ) {
        if ( me < range ) {
            k = 1;
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = (j + r )% P;
                    bsc_get( depends, g?g->gid[j]:j, accum, 0, 
                            &gather[k*size], size );
                    k += 1;
                }
            }
            bsc_get( depends, bsp_pid(), accum, 0, &gather[0], size );
            bsc_exec_reduce( depends, reducer, 
                    range==1?dst:accum, zero, gather, size * k );
        }
        depends += 1;
    }
    return depends;

}